

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O1

mkroom * build_room(level *lev,room *r,mkroom *mkr)

{
  char cVar1;
  byte bVar2;
  boolean bVar3;
  uint uVar4;
  int iVar5;
  char cVar6;
  char cVar7;
  int lowx;
  byte bVar8;
  xchar rtype;
  int iVar9;
  byte bVar10;
  char cVar11;
  mkroom *croom;
  char lit;
  bool bVar12;
  
  if (r->chance != '\0') {
    uVar4 = mt_random();
    if ((int)r->chance <= (int)(uVar4 % 100)) {
      rtype = '\0';
      goto LAB_00254121;
    }
  }
  rtype = r->rtype;
LAB_00254121:
  if (mkr == (mkroom *)0x0) {
    croom = lev->rooms + lev->nroom;
    bVar3 = create_room(lev,r->x,r->y,r->w,r->h,r->xalign,r->yalign,rtype,r->rlit);
    bVar12 = bVar3 == '\0';
  }
  else {
    cVar1 = (mkr->hx - mkr->lx) + '\x01';
    cVar11 = (mkr->hy - mkr->ly) + '\x01';
    bVar12 = true;
    croom = lev->subrooms + lev->nsubroom;
    if ('\x03' < cVar11 && '\x03' < cVar1) {
      cVar6 = r->x;
      cVar7 = r->y;
      bVar8 = r->h;
      lit = r->rlit;
      iVar5 = (int)cVar1;
      bVar10 = r->w;
      if (bVar10 == 0xff) {
        uVar4 = mt_random();
        bVar10 = SUB161(ZEXT416(uVar4) % SEXT816((long)(iVar5 + -3)),0) + 1;
      }
      iVar9 = (int)cVar11;
      if (bVar8 == 0xff) {
        uVar4 = mt_random();
        bVar8 = SUB161(ZEXT416(uVar4) % SEXT816((long)(iVar9 + -3)),0) + 1;
      }
      if (cVar6 == -1) {
        uVar4 = mt_random();
        cVar6 = SUB161(ZEXT416(uVar4) % SEXT816((long)((char)~bVar10 + iVar5)),0);
      }
      if (cVar7 == -1) {
        uVar4 = mt_random();
        cVar7 = SUB161(ZEXT416(uVar4) % SEXT816((long)((char)~bVar8 + iVar9)),0);
      }
      if (cVar6 == '\x01') {
        cVar6 = '\0';
      }
      if (cVar7 == '\x01') {
        cVar7 = '\0';
      }
      if (rtype == -1) {
        rtype = '\0';
      }
      if (lit == -1) {
        bVar2 = depth(&lev->z);
        uVar4 = mt_random();
        lit = '\0';
        if (uVar4 % (uint)(byte)(((bVar2 ^ (char)bVar2 >> 7) - ((char)bVar2 >> 7)) + 1) < 10) {
          uVar4 = mt_random();
          lit = 0x3531dec < uVar4 * 0x3f2b3885;
        }
      }
      lowx = (int)(char)(cVar6 + ((char)bVar10 + 1 + (int)cVar6 == iVar5)) + (int)mkr->lx;
      iVar5 = (int)(char)(cVar7 + ((int)(char)bVar8 + (int)cVar7 + 1 == iVar9)) + (int)mkr->ly;
      add_subroom(lev,mkr,lowx,iVar5,lowx + (char)bVar10 + -1,(char)bVar8 + iVar5 + -1,lit,rtype,
                  '\0');
      bVar12 = false;
    }
  }
  if (bVar12) {
    croom = (mkroom *)0x0;
  }
  else {
    topologize(lev,croom);
    if (croom->rtype == '\0') {
      bVar12 = false;
    }
    else {
      bVar12 = r->filled != '\0';
    }
    croom->needfill = bVar12;
  }
  return croom;
}

Assistant:

static struct mkroom *build_room(struct level *lev, room *r, struct mkroom *mkr)
{
	boolean okroom;
	struct mkroom *aroom;
	xchar rtype = (!r->chance || rn2(100) < r->chance) ? r->rtype : OROOM;

	if (mkr) {
	    aroom = &lev->subrooms[lev->nsubroom];
	    okroom = create_subroom(lev, mkr, r->x, r->y, r->w, r->h,
				    rtype, r->rlit);
	} else {
	    aroom = &lev->rooms[lev->nroom];
	    okroom = create_room(lev, r->x, r->y, r->w, r->h, r->xalign,
				 r->yalign, rtype, r->rlit);
	}

	if (okroom) {
	    topologize(lev, aroom);			/* set roomno */
	    aroom->needfill = ((aroom->rtype != OROOM) && r->filled);
	    return aroom;
	}
	return NULL;
}